

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcChain.c
# Opt level: O2

int Gia_ManCountNonConst0(Gia_Man_t *p)

{
  int iVar1;
  Gia_Obj_t *pObj;
  int v;
  int iVar2;
  
  v = 0;
  iVar2 = 0;
  while( true ) {
    if (p->vCos->nSize - p->nRegs <= v) {
      return iVar2;
    }
    pObj = Gia_ManCo(p,v);
    if (pObj == (Gia_Obj_t *)0x0) break;
    iVar1 = Gia_ObjFaninLit0p(p,pObj);
    iVar2 = (iVar2 + 1) - (uint)(iVar1 == 0);
    v = v + 1;
  }
  return iVar2;
}

Assistant:

int Gia_ManCountNonConst0( Gia_Man_t * p )
{ 
    Gia_Obj_t * pObj;
    int i, Count = 0;
    Gia_ManForEachPo( p, pObj, i )
        Count += (Gia_ObjFaninLit0p(p, pObj) != 0);
    return Count;
}